

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int memdbWrite(sqlite3_file *pFile,void *z,int iAmt,sqlite_int64 iOfst)

{
  long lVar1;
  sqlite3_io_methods *psVar2;
  _func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *p_Var3;
  int iVar4;
  _func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *nBytes;
  long lVar5;
  sqlite3_mutex *psVar6;
  
  psVar2 = pFile[1].pMethods;
  if ((sqlite3_mutex *)psVar2->xTruncate != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar2->xTruncate);
  }
  if (((ulong)psVar2->xSync & 0x400000000) != 0) {
    psVar6 = (sqlite3_mutex *)psVar2->xTruncate;
    iVar4 = 0x30a;
    goto LAB_00147508;
  }
  lVar1 = iAmt + iOfst;
  lVar5 = *(long *)psVar2;
  if (lVar5 < lVar1) {
    if ((long)psVar2->xClose < lVar1) {
      iVar4 = 0xd;
      if (((((ulong)psVar2->xSync & 0x200000000) != 0) && (*(int *)&psVar2->xSync < 1)) &&
         (nBytes = psVar2->xRead, lVar1 <= (long)nBytes)) {
        if (lVar1 * 2 < (long)nBytes) {
          nBytes = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)(lVar1 * 2);
        }
        p_Var3 = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)
                 sqlite3Realloc(psVar2->xWrite,(u64)nBytes);
        if (p_Var3 != (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0) {
          psVar2->xWrite = p_Var3;
          psVar2->xClose = (_func_int_sqlite3_file_ptr *)nBytes;
          lVar5 = *(long *)psVar2;
          goto LAB_001474ce;
        }
        iVar4 = 0xc0a;
      }
      psVar6 = (sqlite3_mutex *)psVar2->xTruncate;
      goto LAB_00147508;
    }
LAB_001474ce:
    if (iOfst - lVar5 != 0 && lVar5 <= iOfst) {
      memset(psVar2->xWrite + lVar5,0,iOfst - lVar5);
    }
    *(long *)psVar2 = lVar1;
  }
  memcpy(psVar2->xWrite + iOfst,z,(long)iAmt);
  psVar6 = (sqlite3_mutex *)psVar2->xTruncate;
  iVar4 = 0;
LAB_00147508:
  if (psVar6 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar6);
  }
  return iVar4;
}

Assistant:

static int memdbWrite(
  sqlite3_file *pFile,
  const void *z,
  int iAmt,
  sqlite_int64 iOfst
){
  MemStore *p = ((MemFile*)pFile)->pStore;
  memdbEnter(p);
  if( NEVER(p->mFlags & SQLITE_DESERIALIZE_READONLY) ){
    /* Can't happen: memdbLock() will return SQLITE_READONLY before
    ** reaching this point */
    memdbLeave(p);
    return SQLITE_IOERR_WRITE;
  }
  if( iOfst+iAmt>p->sz ){
    int rc;
    if( iOfst+iAmt>p->szAlloc
     && (rc = memdbEnlarge(p, iOfst+iAmt))!=SQLITE_OK
    ){
      memdbLeave(p);
      return rc;
    }
    if( iOfst>p->sz ) memset(p->aData+p->sz, 0, iOfst-p->sz);
    p->sz = iOfst+iAmt;
  }
  memcpy(p->aData+iOfst, z, iAmt);
  memdbLeave(p);
  return SQLITE_OK;
}